

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O1

u16 __thiscall moira::Moira::getSR(Moira *this)

{
  int iVar1;
  
  iVar1._0_1_ = (this->reg).sr.t1;
  iVar1._1_1_ = (this->reg).sr.t0;
  iVar1._2_1_ = (this->reg).sr.s;
  iVar1._3_1_ = (this->reg).sr.m;
  return (ushort)(this->reg).sr.x << 4 |
         (ushort)(this->reg).sr.c + (ushort)(this->reg).sr.v * 2 + (ushort)(this->reg).sr.z * 4 +
         (ushort)(this->reg).sr.n * 8 |
         (ushort)(this->reg).sr.ipl << 8 |
         (ushort)(this->reg).sr.m << 0xc | (ushort)(this->reg).sr.s << 0xd |
         (ushort)(this->reg).sr.t0 << 0xe | (ushort)(iVar1 << 0xf);
}

Assistant:

u16
Moira::getSR() const
{
    auto flags =
    reg.sr.t1  << 15 |
    reg.sr.t0  << 14 |
    reg.sr.s   << 13 |
    reg.sr.m   << 12 |
    reg.sr.ipl <<  8 ;

    return u16(flags | getCCR());
}